

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intercept.cpp
# Opt level: O3

bool __thiscall CLIntercept::checkRelaxAllocationLimitsSupport(CLIntercept *this,cl_program program)

{
  cl_device_id *pp_Var1;
  bool bVar2;
  cl_int cVar3;
  cl_uint numDevices;
  cl_device_id *deviceList;
  cl_uint local_2c;
  cl_device_id *local_28;
  
  local_2c = 0;
  local_28 = (cl_device_id *)0x0;
  cVar3 = allocateAndGetProgramDeviceList(this,program,&local_2c,&local_28);
  pp_Var1 = local_28;
  if (cVar3 == 0) {
    bVar2 = checkRelaxAllocationLimitsSupport(this,local_2c,local_28);
  }
  else {
    bVar2 = true;
  }
  if (pp_Var1 != (cl_device_id *)0x0) {
    operator_delete__(pp_Var1);
  }
  return (bool)(cVar3 == 0 & bVar2);
}

Assistant:

bool CLIntercept::checkRelaxAllocationLimitsSupport(
    cl_program program ) const
{
    cl_int  errorCode = CL_SUCCESS;
    bool    supported = true;

    cl_uint         numDevices = 0;
    cl_device_id*   deviceList = NULL;
    if( errorCode == CL_SUCCESS )
    {
        errorCode = allocateAndGetProgramDeviceList(
            program,
            numDevices,
            deviceList );
    }

    if( errorCode == CL_SUCCESS )
    {
        supported = checkRelaxAllocationLimitsSupport(
            numDevices,
            deviceList );
    }

    delete [] deviceList;

    return ( errorCode == CL_SUCCESS ) && supported;
}